

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

FT_Int32 ft_lzwstate_get_code(FT_LzwState state)

{
  int iVar1;
  FT_Byte *pFVar2;
  FT_UInt local_30;
  uint local_2c;
  FT_Byte *pFStack_28;
  FT_Int result;
  FT_Byte *p;
  FT_UInt offset;
  FT_UInt num_bits;
  FT_LzwState state_local;
  
  p._4_4_ = state->num_bits;
  p._0_4_ = state->buf_offset;
  if (((state->buf_clear != '\0') || (state->buf_size <= (uint)p)) ||
     (state->free_bits <= state->free_ent)) {
    if (state->free_bits <= state->free_ent) {
      p._4_4_ = p._4_4_ + 1;
      state->num_bits = p._4_4_;
      if (0x10 < p._4_4_) {
        return -1;
      }
      if (state->num_bits < state->max_bits) {
        local_30 = (int)(1L << ((byte)p._4_4_ & 0x3f)) - 0x100;
      }
      else {
        local_30 = state->max_free + 1;
      }
      state->free_bits = local_30;
    }
    if (state->buf_clear != '\0') {
      p._4_4_ = 9;
      state->num_bits = 9;
      state->free_bits = 0x100;
      state->buf_clear = '\0';
    }
    iVar1 = ft_lzwstate_refill(state);
    if (iVar1 < 0) {
      return -1;
    }
    p._0_4_ = 0;
  }
  state->buf_offset = (uint)p + p._4_4_;
  pFVar2 = state->buf_tab + ((uint)p >> 3);
  local_2c = (int)(uint)*pFVar2 >> (sbyte)((uint)p & 7);
  iVar1 = -((uint)p & 7);
  p._0_4_ = iVar1 + 8;
  p._4_4_ = p._4_4_ - (uint)p;
  pFStack_28 = pFVar2 + 1;
  if (7 < p._4_4_) {
    pFStack_28 = pFVar2 + 2;
    local_2c = (uint)pFVar2[1] << ((byte)(uint)p & 0x1f) | local_2c;
    p._0_4_ = iVar1 + 0x10;
    p._4_4_ = p._4_4_ - 8;
  }
  if (p._4_4_ != 0) {
    local_2c = ((uint)*pFStack_28 & (1 << ((byte)p._4_4_ & 0x1f)) - 1U) << ((byte)(uint)p & 0x1f) |
               local_2c;
  }
  return local_2c;
}

Assistant:

static FT_Int32
  ft_lzwstate_get_code( FT_LzwState  state )
  {
    FT_UInt   num_bits = state->num_bits;
    FT_UInt   offset   = state->buf_offset;
    FT_Byte*  p;
    FT_Int    result;


    if ( state->buf_clear                    ||
         offset >= state->buf_size           ||
         state->free_ent >= state->free_bits )
    {
      if ( state->free_ent >= state->free_bits )
      {
        state->num_bits = ++num_bits;
        if ( num_bits > LZW_MAX_BITS )
          return -1;

        state->free_bits = state->num_bits < state->max_bits
                           ? (FT_UInt)( ( 1UL << num_bits ) - 256 )
                           : state->max_free + 1;
      }

      if ( state->buf_clear )
      {
        state->num_bits  = num_bits = LZW_INIT_BITS;
        state->free_bits = (FT_UInt)( ( 1UL << num_bits ) - 256 );
        state->buf_clear = 0;
      }

      if ( ft_lzwstate_refill( state ) < 0 )
        return -1;

      offset = 0;
    }

    state->buf_offset = offset + num_bits;

    p         = &state->buf_tab[offset >> 3];
    offset   &= 7;
    result    = *p++ >> offset;
    offset    = 8 - offset;
    num_bits -= offset;

    if ( num_bits >= 8 )
    {
      result   |= *p++ << offset;
      offset   += 8;
      num_bits -= 8;
    }
    if ( num_bits > 0 )
      result |= ( *p & LZW_MASK( num_bits ) ) << offset;

    return result;
  }